

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeFrameDelete(VdbeFrame *p)

{
  VdbeCursor *pCx;
  long in_RDI;
  VdbeCursor **apCsr;
  Mem *aMem;
  int i;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *db;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  pCx = (VdbeCursor *)(in_RDI + 0x70);
  db = (sqlite3 *)(pCx->aType + (long)*(int *)(in_RDI + 0x58) * 0xe + -0x1c);
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x5c); iVar1 = iVar1 + 1) {
    if ((&db->pVfs)[iVar1] != (sqlite3_vfs *)0x0) {
      sqlite3VdbeFreeCursorNN((Vdbe *)CONCAT44(iVar1,in_stack_fffffffffffffff0),pCx);
    }
  }
  releaseMemArray((Mem *)CONCAT44(iVar1,in_stack_fffffffffffffff0),(int)((ulong)pCx >> 0x20));
  sqlite3VdbeDeleteAuxData
            ((sqlite3 *)CONCAT44(iVar1,in_stack_fffffffffffffff0),(AuxData **)pCx,
             (int)((ulong)db >> 0x20),(int)db);
  sqlite3DbFree(db,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFrameDelete(VdbeFrame *p){
  int i;
  Mem *aMem = VdbeFrameMem(p);
  VdbeCursor **apCsr = (VdbeCursor **)&aMem[p->nChildMem];
  assert( sqlite3VdbeFrameIsValid(p) );
  for(i=0; i<p->nChildCsr; i++){
    if( apCsr[i] ) sqlite3VdbeFreeCursorNN(p->v, apCsr[i]);
  }
  releaseMemArray(aMem, p->nChildMem);
  sqlite3VdbeDeleteAuxData(p->v->db, &p->pAuxData, -1, 0);
  sqlite3DbFree(p->v->db, p);
}